

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreenCast::Drawer(DIntermissionScreenCast *this)

{
  ushort uVar1;
  FFont *font;
  DFrameBuffer *pDVar2;
  FPlayerSkin *pFVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  FPlayerClass *pFVar10;
  spritedef_t *psVar11;
  spriteframe_t *psVar12;
  FTexture *this_00;
  bool bVar13;
  double dVar14;
  double dVar15;
  TFlags<ActorFlag4,_unsigned_int> local_54;
  FPlayerSkin *local_50;
  FPlayerSkin *skin;
  TFlags<ActorFlag4,_unsigned_int> local_40;
  uint i;
  undefined1 auStack_38 [4];
  int castsprite;
  DVector2 castscale;
  char *name;
  FTexture *pic;
  spriteframe_t *sprframe;
  DIntermissionScreenCast *this_local;
  
  DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
  castscale.Y = (double)this->mName;
  if ((char *)castscale.Y != (char *)0x0) {
    if (*(char *)castscale.Y == '$') {
      castscale.Y = (double)FStringTable::operator()(&GStrings,(char *)((long)castscale.Y + 1));
    }
    pDVar2 = screen;
    font = SmallFont;
    iVar5 = DCanvas::GetWidth((DCanvas *)screen);
    iVar6 = FFont::StringWidth(SmallFont,(char *)castscale.Y);
    iVar6 = iVar6 * CleanXfac;
    iVar7 = DCanvas::GetHeight((DCanvas *)screen);
    DCanvas::DrawText((DCanvas *)pDVar2,font,0xb,(iVar5 - iVar6) / 2,(iVar7 * 0xb4) / 200,
                      (char *)castscale.Y,0x40001393,1,0);
  }
  if (this->caststate != (FState *)0x0) {
    TVector2<double>::TVector2((TVector2<double> *)auStack_38,&this->mDefaults->Scale);
    i = this->caststate->sprite;
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_40,
               (int)this->mDefaults +
               (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
    uVar8 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
    bVar13 = false;
    if (((uVar8 == 0) && (bVar13 = false, this->mDefaults->SpawnState != (FState *)0x0)) &&
       (bVar13 = false, this->caststate->sprite == this->mDefaults->SpawnState->sprite)) {
      bVar4 = PClass::IsDescendantOf
                        (&this->mClass->super_PClass,APlayerPawn::RegistrationInfo.MyClass);
      bVar13 = false;
      if (bVar4) {
        bVar13 = skins != (FPlayerSkin *)0x0;
      }
    }
    if (bVar13) {
      for (skin._4_4_ = 0; uVar8 = skin._4_4_,
          uVar9 = TArray<FPlayerClass,_FPlayerClass>::Size(&PlayerClasses), uVar8 < uVar9;
          skin._4_4_ = skin._4_4_ + 1) {
        pFVar10 = TArray<FPlayerClass,_FPlayerClass>::operator[](&PlayerClasses,(ulong)skin._4_4_);
        pFVar3 = skins;
        if (pFVar10->Type == (PClassPlayerPawn *)this->mClass) {
          iVar5 = userinfo_t::GetSkin((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
          local_50 = pFVar3 + iVar5;
          i = local_50->sprite;
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    (&local_54,
                     (int)this->mDefaults +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
          uVar8 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_54);
          if (uVar8 == 0) {
            TVector2<double>::operator=((TVector2<double> *)auStack_38,&local_50->Scale);
          }
        }
      }
    }
    psVar11 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(long)(int)i);
    uVar1 = psVar11->spriteframes;
    iVar5 = FState::GetFrame(this->caststate);
    psVar12 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                        (&SpriteFrames,(long)(int)((uint)uVar1 + iVar5));
    this_00 = FTextureManager::operator()(&TexMan,(FTextureID)psVar12->Texture[0].texnum,false);
    pDVar2 = screen;
    uVar1 = psVar12->Flip;
    dVar14 = FTexture::GetScaledHeightDouble(this_00);
    dVar15 = FTexture::GetScaledWidthDouble(this_00);
    DCanvas::DrawTexture
              ((DCanvas *)pDVar2,this_00,160.0,170.0,0x40001391,dVar14 * castscale.X,
               dVar15 * _auStack_38,this->mDefaults->Alpha,1,0x40001395,(ulong)(uVar1 & 1),
               0x400013b0,0x400013af,0x400013a9,(this->mDefaults->RenderStyle).AsDWORD,0x4000138c,
               0x4000138e,this->casttranslation,0);
  }
  return;
}

Assistant:

void DIntermissionScreenCast::Drawer ()
{
	spriteframe_t*		sprframe;
	FTexture*			pic;

	Super::Drawer();

	const char *name = mName;
	if (name != NULL)
	{
		if (*name == '$') name = GStrings(name+1);
		screen->DrawText (SmallFont, CR_UNTRANSLATED,
			(SCREENWIDTH - SmallFont->StringWidth (name) * CleanXfac)/2,
			(SCREENHEIGHT * 180) / 200,
			name,
			DTA_CleanNoMove, true, TAG_DONE);
	}

	// draw the current frame in the middle of the screen
	if (caststate != NULL)
	{
		DVector2 castscale = mDefaults->Scale;

		int castsprite = caststate->sprite;

		if (!(mDefaults->flags4 & MF4_NOSKIN) &&
			mDefaults->SpawnState != NULL && caststate->sprite == mDefaults->SpawnState->sprite &&
			mClass->IsDescendantOf(RUNTIME_CLASS(APlayerPawn)) &&
			skins != NULL)
		{
			// Only use the skin sprite if this class has not been removed from the
			// PlayerClasses list.
			for (unsigned i = 0; i < PlayerClasses.Size(); ++i)
			{
				if (PlayerClasses[i].Type == mClass)
				{
					FPlayerSkin *skin = &skins[players[consoleplayer].userinfo.GetSkin()];
					castsprite = skin->sprite;

					if (!(mDefaults->flags4 & MF4_NOSKIN))
					{
						castscale = skin->Scale;
					}

				}
			}
		}

		sprframe = &SpriteFrames[sprites[castsprite].spriteframes + caststate->GetFrame()];
		pic = TexMan(sprframe->Texture[0]);

		screen->DrawTexture (pic, 160, 170,
			DTA_320x200, true,
			DTA_FlipX, sprframe->Flip & 1,
			DTA_DestHeightF, pic->GetScaledHeightDouble() * castscale.Y,
			DTA_DestWidthF, pic->GetScaledWidthDouble() * castscale.X,
			DTA_RenderStyle, mDefaults->RenderStyle,
			DTA_AlphaF, mDefaults->Alpha,
			DTA_Translation, casttranslation,
			TAG_DONE);
	}
}